

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.h
# Opt level: O0

OutputStream * __thiscall OutputStream::operator+=(OutputStream *this,StringView R)

{
  char *pcVar1;
  size_t sVar2;
  size_t N;
  char *__src;
  size_t Size;
  OutputStream *this_local;
  StringView R_local;
  
  R_local.First = R.Last;
  this_local = (OutputStream *)R.First;
  N = StringView::size((StringView *)&this_local);
  if (N != 0) {
    grow(this,N);
    pcVar1 = this->Buffer;
    sVar2 = this->CurrentPosition;
    __src = StringView::begin((StringView *)&this_local);
    memmove(pcVar1 + sVar2,__src,N);
    this->CurrentPosition = N + this->CurrentPosition;
  }
  return this;
}

Assistant:

OutputStream &operator+=(StringView R) {
    size_t Size = R.size();
    if (Size == 0)
      return *this;
    grow(Size);
    std::memmove(Buffer + CurrentPosition, R.begin(), Size);
    CurrentPosition += Size;
    return *this;
  }